

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFailure_EqualsFailure_Test::testBody(TEST_TestFailure_EqualsFailure_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  EqualsFailure f;
  undefined1 local_88 [120];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_88,"");
  EqualsFailure::EqualsFailure
            ((EqualsFailure *)(local_88 + 0x10),pUVar1,"fail.cpp",2,"expected","actual",
             (SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"expected <expected>\n\tbut was  <actual>",pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x4c,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
  return;
}

Assistant:

TEST(TestFailure, EqualsFailure)
{
    EqualsFailure f(test, failFileName, failLineNumber, "expected", "actual", "");
    FAILURE_EQUAL("expected <expected>\n\tbut was  <actual>", f);
}